

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car.cpp
# Opt level: O2

int __thiscall Car::get_ypos(Car *this)

{
  int iVar1;
  
  std::mutex::lock(&this->mtx);
  iVar1 = this->_ypos;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return iVar1;
}

Assistant:

int Car::get_ypos(){
         std::lock_guard lck(mtx);
         return _ypos;
    }